

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void lzma_index_end(lzma_index *i,lzma_allocator *allocator)

{
  lzma_allocator *allocator_local;
  lzma_index *i_local;
  
  if (i != (lzma_index *)0x0) {
    index_tree_end(&i->streams,allocator,index_stream_end);
    lzma_free(i,allocator);
  }
  return;
}

Assistant:

extern LZMA_API(void)
lzma_index_end(lzma_index *i, lzma_allocator *allocator)
{
	// NOTE: If you modify this function, check also the bottom
	// of lzma_index_cat().
	if (i != NULL) {
		index_tree_end(&i->streams, allocator, &index_stream_end);
		lzma_free(i, allocator);
	}

	return;
}